

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::containsAfterUintCast
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *haystack,
               deInt32 needle,Precision precision)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  p_Var2 = (haystack->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(haystack->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    bVar1 = false;
  }
  else {
    do {
      bVar1 = intEqualsAfterUintCast(needle,p_Var2[1]._M_color,precision);
      if (bVar1) {
        return bVar1;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return bVar1;
}

Assistant:

static bool containsAfterUintCast (const std::set<deUint32>& haystack, deInt32 needle, glu::Precision precision)
{
	for (std::set<deUint32>::const_iterator it = haystack.begin(); it != haystack.end(); ++it)
		if (intEqualsAfterUintCast(needle, *it, precision))
			return true;
	return false;
}